

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O3

void __thiscall RVO::RVOSimulator::~RVOSimulator(RVOSimulator *this)

{
  Agent *pAVar1;
  KdTree *this_00;
  Obstacle *this_01;
  pointer ppAVar2;
  pointer ppOVar3;
  ulong uVar4;
  
  pAVar1 = this->defaultAgent_;
  if (pAVar1 != (Agent *)0x0) {
    Agent::~Agent(pAVar1);
  }
  operator_delete(pAVar1);
  this_00 = this->kdTree_;
  if (this_00 != (KdTree *)0x0) {
    KdTree::~KdTree(this_00);
  }
  operator_delete(this_00);
  ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar2) {
    uVar4 = 0;
    do {
      pAVar1 = ppAVar2[uVar4];
      if (pAVar1 != (Agent *)0x0) {
        Agent::~Agent(pAVar1);
      }
      operator_delete(pAVar1);
      uVar4 = uVar4 + 1;
      ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->agents_).
                                   super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3));
  }
  ppOVar3 = (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppOVar3) {
    uVar4 = 0;
    do {
      this_01 = ppOVar3[uVar4];
      if (this_01 != (Obstacle *)0x0) {
        Obstacle::~Obstacle(this_01);
      }
      operator_delete(this_01);
      uVar4 = uVar4 + 1;
      ppOVar3 = (this->obstacles_).
                super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->obstacles_).
                                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3 >> 3))
    ;
  }
  if (ppOVar3 != (pointer)0x0) {
    operator_delete(ppOVar3);
  }
  ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar2 != (pointer)0x0) {
    operator_delete(ppAVar2);
    return;
  }
  return;
}

Assistant:

RVOSimulator::~RVOSimulator() {
  delete defaultAgent_;
  delete kdTree_;

  for (std::size_t i = 0U; i < agents_.size(); ++i) {
    delete agents_[i];
  }

  for (std::size_t i = 0U; i < obstacles_.size(); ++i) {
    delete obstacles_[i];
  }
}